

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Register.cpp
# Opt level: O0

void OpenMD::registerLattice(void)

{
  allocator<char> *__a;
  char *__s;
  LatticeFactory *this;
  string *in_stack_ffffffffffffff28;
  LatticeBuilder<OpenMD::SCLattice> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_81;
  string local_80 [38];
  undefined1 local_5a;
  allocator<char> local_59;
  LatticeCreator *in_stack_ffffffffffffffa8;
  LatticeFactory *in_stack_ffffffffffffffb0;
  undefined1 local_21 [33];
  
  __a = (allocator<char> *)LatticeFactory::getInstance();
  __s = (char *)operator_new(0x28);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_21;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  LatticeBuilder<OpenMD::FCCLattice>::LatticeBuilder
            ((LatticeBuilder<OpenMD::FCCLattice> *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  LatticeFactory::registerLattice(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)(local_21 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_21);
  LatticeFactory::getInstance();
  operator_new(0x28);
  local_5a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  LatticeBuilder<OpenMD::SCLattice>::LatticeBuilder
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_5a = 0;
  LatticeFactory::registerLattice(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::allocator<char>::~allocator(&local_59);
  this = LatticeFactory::getInstance();
  operator_new(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  LatticeBuilder<OpenMD::BCCLattice>::LatticeBuilder
            ((LatticeBuilder<OpenMD::BCCLattice> *)this,in_stack_ffffffffffffff28);
  LatticeFactory::registerLattice(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  return;
}

Assistant:

void registerLattice() {
    LatticeFactory::getInstance().registerLattice(
        new LatticeBuilder<FCCLattice>("FCC"));
    LatticeFactory::getInstance().registerLattice(
        new LatticeBuilder<SCLattice>("SC"));
    LatticeFactory::getInstance().registerLattice(
        new LatticeBuilder<BCCLattice>("BCC"));
  }